

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::NTSCD::computeDependencies(NTSCD *this)

{
  bool bVar1;
  Module *llvmFunction;
  LLVMControlDependenceAnalysisImpl *in_RDI;
  StringRef SVar2;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> *it;
  const_iterator __end2;
  const_iterator __begin2;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range2;
  Function *entryFunc;
  Function *entryFunction;
  undefined1 in_stack_0000026f;
  Function *in_stack_00000270;
  GraphBuilder *in_stack_00000278;
  Function *in_stack_ffffffffffffff98;
  NTSCD *in_stack_ffffffffffffffa0;
  GraphBuilder *in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  _Self local_38;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *local_30;
  Function *local_28;
  size_t local_20;
  long local_10;
  
  llvmFunction = LLVMControlDependenceAnalysisImpl::getModule(in_RDI);
  LLVMControlDependenceAnalysisImpl::getOptions(in_RDI);
  llvm::StringRef::StringRef
            ((StringRef *)in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
  SVar2.Length = local_20;
  SVar2.Data = (char *)llvmFunction;
  local_10 = llvm::Module::getFunction(SVar2);
  if (local_10 == 0) {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)llvmFunction,(char *)in_RDI);
    LLVMControlDependenceAnalysisImpl::getOptions(in_RDI);
    llvm::raw_ostream::operator<<((raw_ostream *)llvmFunction,(string *)in_RDI);
    llvm::raw_ostream::operator<<((raw_ostream *)llvmFunction,(char *)in_RDI);
  }
  else {
    GraphBuilder::buildFunction(in_stack_00000278,in_stack_00000270,(bool)in_stack_0000026f);
    local_28 = GraphBuilder::findFunction(in_stack_ffffffffffffffb8,(Function *)llvmFunction);
    Function::entry(local_28);
    Block::visit((Block *)in_stack_ffffffffffffffc0._M_node);
    local_30 = GraphBuilder::functions((GraphBuilder *)(in_RDI + 1));
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         ::begin((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                  *)in_stack_ffffffffffffff98);
    std::
    map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
    ::end((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
           *)in_stack_ffffffffffffff98);
    while (bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0), bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                   *)0x22923b);
      computeDependencies(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                    *)in_stack_ffffffffffffffa0);
    }
  }
  return;
}

Assistant:

void NTSCD::computeDependencies() {
    DBG_SECTION_BEGIN(cda, "Computing CD for the whole module");
    auto *entryFunction = getModule()->getFunction(getOptions().entryFunction);
    if (!entryFunction) {
        llvm::errs() << "Missing entry function: " << getOptions().entryFunction
                     << "\n";
        return;
    }

    graphBuilder.buildFunction(entryFunction, /* recursively = */ true);
    auto *entryFunc = graphBuilder.findFunction(entryFunction);

    entryFunc->entry()->visit();

    for (const auto &it : graphBuilder.functions()) {
        computeDependencies(it.second);
    }
    DBG_SECTION_END(cda, "Finished computing CD for the whole module");
}